

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

size_type cmSystemToolsFindRPath(string *have,string *want)

{
  bool bVar1;
  long lVar2;
  size_type sVar3;
  byte *pbVar4;
  string regex_str;
  RegularExpression regex;
  long *local_120;
  ulong local_118;
  long local_110 [2];
  RegularExpression local_100;
  
  lVar2 = std::__cxx11::string::find((char *)have,(ulong)(want->_M_dataplus)._M_p,0);
  if (lVar2 == -1) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    local_120 = local_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"(^|:)(","");
    if (want->_M_string_length != 0) {
      pbVar4 = (byte *)(want->_M_dataplus)._M_p;
      do {
        if ((9 < (byte)(*pbVar4 - 0x30)) && (0x19 < (byte)((*pbVar4 & 0xdf) + 0xbf))) {
          std::__cxx11::string::append((char *)&local_120);
        }
        std::__cxx11::string::_M_replace_aux((ulong)&local_120,local_118,0,'\x01');
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 != (byte *)((want->_M_dataplus)._M_p + want->_M_string_length));
    }
    std::__cxx11::string::append((char *)&local_120);
    local_100.program = (char *)0x0;
    if (local_120 != (long *)0x0) {
      cmsys::RegularExpression::compile(&local_100,(char *)local_120);
    }
    bVar1 = cmsys::RegularExpression::find(&local_100,(have->_M_dataplus)._M_p);
    sVar3 = 0xffffffffffffffff;
    if (bVar1) {
      sVar3 = (long)local_100.startp[2] - (long)local_100.searchstring;
    }
    if (local_100.program != (char *)0x0) {
      operator_delete__(local_100.program);
    }
    if (local_120 != local_110) {
      operator_delete(local_120,local_110[0] + 1);
    }
  }
  return sVar3;
}

Assistant:

std::string::size_type cmSystemToolsFindRPath(std::string const& have,
                                              std::string const& want)
{
  // Search for the desired rpath.
  std::string::size_type pos = have.find(want);

  // If the path is not present we are done.
  if(pos == std::string::npos)
    {
    return pos;
    }

  // Build a regex to match a properly separated path instance.
  std::string regex_str = "(^|:)(";
  for(std::string::const_iterator i = want.begin(); i != want.end(); ++i)
    {
    int ch = *i;
    if(!(('a' <= ch && ch <= 'z') ||
         ('A' <= ch && ch <= 'Z') ||
         ('0' <= ch && ch <= '9')))
      {
      // Escape the non-alphanumeric character.
      regex_str += "\\";
      }
    // Store the character.
    regex_str.append(1, static_cast<char>(ch));
    }
  regex_str += ")(:|$)";

  // Look for the separated path.
  cmsys::RegularExpression regex(regex_str.c_str());
  if(regex.find(have))
    {
    // Return the position of the path portion.
    return regex.start(2);
    }
  else
    {
    // The desired rpath was not found.
    return std::string::npos;
    }
}